

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_store(unqlite *pDb,void *pKey,int nKeyLen,void *pData,unqlite_int64 nDataLen)

{
  unqlite_kv_engine *puVar1;
  int local_44;
  int rc;
  unqlite_kv_engine *pEngine;
  unqlite_int64 nDataLen_local;
  void *pData_local;
  int nKeyLen_local;
  void *pKey_local;
  unqlite *pDb_local;
  
  if ((pDb == (unqlite *)0x0) || (pDb->nMagic != 0xdb7c2712)) {
    pDb_local._4_4_ = -0x18;
  }
  else {
    puVar1 = unqlitePagerGetKvEngine(pDb);
    if (puVar1->pIo->pMethods->xReplace ==
        (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
      unqliteGenError(pDb,"xReplace() method not implemented in the underlying storage engine");
      local_44 = -0x11;
    }
    else {
      pData_local._4_4_ = nKeyLen;
      if (nKeyLen < 0) {
        pData_local._4_4_ = SyStrlen((char *)pKey);
      }
      if (pData_local._4_4_ == 0) {
        unqliteGenError(pDb,"Empty key");
        local_44 = -3;
      }
      else {
        local_44 = (*puVar1->pIo->pMethods->xReplace)(puVar1,pKey,pData_local._4_4_,pData,nDataLen);
      }
    }
    pDb_local._4_4_ = local_44;
  }
  return pDb_local._4_4_;
}

Assistant:

int unqlite_kv_store(unqlite *pDb,const void *pKey,int nKeyLen,const void *pData,unqlite_int64 nDataLen)
{
	unqlite_kv_engine *pEngine;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 if( pEngine->pIo->pMethods->xReplace == 0 ){
		 /* Storage engine does not implement such method */
		 unqliteGenError(pDb,"xReplace() method not implemented in the underlying storage engine");
		 rc = UNQLITE_NOTIMPLEMENTED;
	 }else{
		 if( nKeyLen < 0 ){
			 /* Assume a null terminated string and compute it's length */
			 nKeyLen = SyStrlen((const char *)pKey);
		 }
		 if( !nKeyLen ){
			 unqliteGenError(pDb,"Empty key");
			 rc = UNQLITE_EMPTY;
		 }else{
			 /* Perform the requested operation */
			 rc = pEngine->pIo->pMethods->xReplace(pEngine,pKey,nKeyLen,pData,nDataLen);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}